

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDefaultVertexAttributeTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::DefaultVertexAttributeTests::init
          (DefaultVertexAttributeTests *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  DataType dataType;
  TestContext *testCtx;
  char *name;
  Context *pCVar2;
  TestNode *this_00;
  int extraout_EAX;
  long *plVar3;
  TestNode *pTVar4;
  undefined8 *puVar5;
  AttributeCase *pAVar6;
  TestNode *pTVar7;
  FloatLoader *pFVar8;
  long *plVar9;
  long lVar10;
  undefined4 *local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined2 uStack_72;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  TestNode *local_48;
  TestNode *local_40;
  long local_38;
  
  lVar10 = 0xc;
  local_40 = (TestNode *)this;
  do {
    local_48 = (TestNode *)operator_new(0x70);
    testCtx = ((TestNode *)this)->m_testCtx;
    name = *(char **)((long)&PTR_iterate_02127de0 + lVar10 + 4);
    local_88 = &local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"test with ","");
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
    plVar9 = plVar3 + 2;
    if ((long *)*plVar3 == plVar9) {
      local_58 = *plVar9;
      lStack_50 = plVar3[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar9;
      local_68 = (long *)*plVar3;
    }
    local_60 = plVar3[1];
    *plVar3 = (long)plVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_48,testCtx,name,(char *)local_68);
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78)))
                               + 1);
    }
    cVar1 = *(char *)((long)&init::floatTargets[0].name + lVar10);
    pCVar2 = (Context *)local_40[1]._vptr_TestNode;
    dataType = *(DataType *)(&UNK_02127dec + lVar10);
    pTVar4 = (TestNode *)operator_new(0xb0);
    local_88 = &local_78;
    uStack_74 = 0x20;
    local_78 = 0x74736554;
    local_80 = 5;
    uStack_73 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_68 = &local_58;
    plVar9 = plVar3 + 2;
    if ((long *)*plVar3 == plVar9) {
      local_58 = *plVar9;
      lStack_50 = plVar3[3];
    }
    else {
      local_58 = *plVar9;
      local_68 = (long *)*plVar3;
    }
    local_60 = plVar3[1];
    *plVar3 = (long)plVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar2->m_testCtx,"vertex_attrib_1f",(char *)local_68);
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_02127e88;
    *(undefined2 *)&pTVar4[1].m_testCtx = 0x100;
    pTVar4[1].m_name._M_dataplus._M_p = "VertexAttrib1f";
    *(DataType *)&pTVar4[1].m_name._M_string_length = dataType;
    pTVar4[1].m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pTVar4[1].m_name.field_2 + 8) = 0;
    *(undefined4 *)&pTVar4[1].m_description._M_dataplus._M_p = 0;
    *(undefined1 *)((long)&pTVar4[1].m_description._M_dataplus._M_p + 4) = 1;
    *(undefined4 *)&pTVar4[1].m_description._M_string_length = 0;
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    local_38 = lVar10;
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78)))
                               + 1);
    }
    puVar5 = (undefined8 *)operator_new(8);
    pTVar7 = local_48;
    *puVar5 = &PTR__FloatLoader_02127ed8;
    *(undefined8 **)&pTVar4[1].m_name.field_2 = puVar5;
    tcu::TestNode::addChild(local_48,pTVar4);
    pTVar4 = local_40;
    pCVar2 = (Context *)local_40[1]._vptr_TestNode;
    if (cVar1 == '\0') {
      pTVar7 = (TestNode *)operator_new(0xb0);
      local_88 = &local_78;
      uStack_74 = 0x20;
      local_78 = 0x74736554;
      local_80 = 5;
      uStack_73 = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
      pTVar4 = local_40;
      local_68 = &local_58;
      plVar9 = plVar3 + 2;
      if ((long *)*plVar3 == plVar9) {
        local_58 = *plVar9;
        lStack_50 = plVar3[3];
      }
      else {
        local_58 = *plVar9;
        local_68 = (long *)*plVar3;
      }
      local_60 = plVar3[1];
      *plVar3 = (long)plVar9;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar7,pCVar2->m_testCtx,"vertex_attrib_2f",(char *)local_68);
      pTVar7[1]._vptr_TestNode = (_func_int **)pCVar2;
      pTVar7->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_02127e88;
      *(undefined2 *)&pTVar7[1].m_testCtx = 0x100;
      pTVar7[1].m_name._M_dataplus._M_p = "VertexAttrib2f";
      *(DataType *)&pTVar7[1].m_name._M_string_length = dataType;
      pTVar7[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar7[1].m_name.field_2 + 8) = 0;
      *(undefined4 *)&pTVar7[1].m_description._M_dataplus._M_p = 0;
      *(undefined1 *)((long)&pTVar7[1].m_description._M_dataplus._M_p + 4) = 1;
      *(undefined4 *)&pTVar7[1].m_description._M_string_length = 0;
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78))
                                         ) + 1);
      }
      puVar5 = (undefined8 *)operator_new(8);
      *puVar5 = &PTR__FloatLoader_02127f28;
      *(undefined8 **)&pTVar7[1].m_name.field_2 = puVar5;
      tcu::TestNode::addChild(local_48,pTVar7);
      pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
      pTVar4 = (TestNode *)operator_new(0xb0);
      local_88 = &local_78;
      uStack_74 = 0x20;
      local_78 = 0x74736554;
      local_80 = 5;
      uStack_73 = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
      plVar9 = plVar3 + 2;
      if ((long *)*plVar3 == plVar9) {
        local_58 = *plVar9;
        lStack_50 = plVar3[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar9;
        local_68 = (long *)*plVar3;
      }
      local_60 = plVar3[1];
      *plVar3 = (long)plVar9;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar4,pCVar2->m_testCtx,"vertex_attrib_3f",(char *)local_68);
      pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
      pTVar4->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_02127e88;
      *(undefined2 *)&pTVar4[1].m_testCtx = 0x100;
      pTVar4[1].m_name._M_dataplus._M_p = "VertexAttrib3f";
      *(DataType *)&pTVar4[1].m_name._M_string_length = dataType;
      pTVar4[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar4[1].m_name.field_2 + 8) = 0;
      *(undefined4 *)&pTVar4[1].m_description._M_dataplus._M_p = 0;
      *(undefined1 *)((long)&pTVar4[1].m_description._M_dataplus._M_p + 4) = 1;
      *(undefined4 *)&pTVar4[1].m_description._M_string_length = 0;
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
      pTVar7 = local_40;
      if (local_88 != &local_78) {
        operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78))
                                         ) + 1);
      }
      puVar5 = (undefined8 *)operator_new(8);
      this_00 = local_48;
      *puVar5 = &PTR__FloatLoader_02127f68;
      *(undefined8 **)&pTVar4[1].m_name.field_2 = puVar5;
      tcu::TestNode::addChild(local_48,pTVar4);
      pAVar6 = anon_unknown_1::AttributeCase::
               create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib4f>
                         ((Context *)pTVar7[1]._vptr_TestNode,dataType);
      tcu::TestNode::addChild(this_00,(TestNode *)pAVar6);
      pAVar6 = anon_unknown_1::AttributeCase::
               create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib1fv>
                         ((Context *)pTVar7[1]._vptr_TestNode,dataType);
      tcu::TestNode::addChild(this_00,(TestNode *)pAVar6);
      pCVar2 = (Context *)pTVar7[1]._vptr_TestNode;
      pTVar4 = (TestNode *)operator_new(0xb0);
      local_88 = &local_78;
      uStack_74 = 0x20;
      local_78 = 0x74736554;
      local_80 = 5;
      uStack_73 = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
      plVar9 = plVar3 + 2;
      if ((long *)*plVar3 == plVar9) {
        local_58 = *plVar9;
        lStack_50 = plVar3[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar9;
        local_68 = (long *)*plVar3;
      }
      local_60 = plVar3[1];
      *plVar3 = (long)plVar9;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar4,pCVar2->m_testCtx,"vertex_attrib_2fv",(char *)local_68);
      pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
      pTVar4->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_02127e88;
      *(undefined2 *)&pTVar4[1].m_testCtx = 0x100;
      pTVar4[1].m_name._M_dataplus._M_p = "VertexAttrib2fv";
      *(DataType *)&pTVar4[1].m_name._M_string_length = dataType;
      pTVar4[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar4[1].m_name.field_2 + 8) = 0;
      *(undefined4 *)&pTVar4[1].m_description._M_dataplus._M_p = 0;
      *(undefined1 *)((long)&pTVar4[1].m_description._M_dataplus._M_p + 4) = 1;
      *(undefined4 *)&pTVar4[1].m_description._M_string_length = 0;
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
      pTVar7 = local_40;
      if (local_88 != &local_78) {
        operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78))
                                         ) + 1);
      }
      puVar5 = (undefined8 *)operator_new(8);
      *puVar5 = &PTR__FloatLoader_02128028;
      *(undefined8 **)&pTVar4[1].m_name.field_2 = puVar5;
      tcu::TestNode::addChild(local_48,pTVar4);
      pCVar2 = (Context *)pTVar7[1]._vptr_TestNode;
      pAVar6 = (AttributeCase *)operator_new(0xb0);
      local_88 = &local_78;
      uStack_74 = 0x20;
      local_78 = 0x74736554;
      local_80 = 5;
      uStack_73 = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
      plVar9 = plVar3 + 2;
      if ((long *)*plVar3 == plVar9) {
        local_58 = *plVar9;
        lStack_50 = plVar3[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar9;
        local_68 = (long *)*plVar3;
      }
      local_60 = plVar3[1];
      *plVar3 = (long)plVar9;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pAVar6,pCVar2->m_testCtx,"vertex_attrib_3fv",(char *)local_68);
      (pAVar6->super_TestCase).m_context = pCVar2;
      (pAVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__AttributeCase_02127e88;
      pAVar6->m_normalizing = false;
      pAVar6->m_useNegativeValues = true;
      pAVar6->m_funcName = "VertexAttrib3fv";
      pAVar6->m_dataType = dataType;
      pAVar6->m_loader = (FloatLoader *)0x0;
      pAVar6->m_program = (ShaderProgram *)0x0;
      pAVar6->m_bufID = 0;
      pAVar6->m_allIterationsPassed = true;
      pAVar6->m_iteration = 0;
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78))
                                         ) + 1);
      }
      pFVar8 = (FloatLoader *)operator_new(8);
      pFVar8->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_02128068;
      pAVar6->m_loader = pFVar8;
      pTVar7 = local_48;
      pTVar4 = local_40;
    }
    else {
      pAVar6 = anon_unknown_1::AttributeCase::
               create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib4f>
                         (pCVar2,dataType);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pAVar6);
      pAVar6 = anon_unknown_1::AttributeCase::
               create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib1fv>
                         ((Context *)pTVar4[1]._vptr_TestNode,dataType);
    }
    tcu::TestNode::addChild(pTVar7,(TestNode *)pAVar6);
    pCVar2 = (Context *)pTVar4[1]._vptr_TestNode;
    pTVar4 = (TestNode *)operator_new(0xb0);
    local_88 = &local_78;
    uStack_74 = 0x20;
    local_78 = 0x74736554;
    local_80 = 5;
    uStack_73 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
    lVar10 = local_38;
    plVar9 = plVar3 + 2;
    if ((long *)*plVar3 == plVar9) {
      local_58 = *plVar9;
      lStack_50 = plVar3[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar9;
      local_68 = (long *)*plVar3;
    }
    local_60 = plVar3[1];
    *plVar3 = (long)plVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar2->m_testCtx,"vertex_attrib_4fv",(char *)local_68);
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__AttributeCase_02127e88;
    *(undefined2 *)&pTVar4[1].m_testCtx = 0x100;
    pTVar4[1].m_name._M_dataplus._M_p = "VertexAttrib4fv";
    *(DataType *)&pTVar4[1].m_name._M_string_length = dataType;
    pTVar4[1].m_name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pTVar4[1].m_name.field_2 + 8) = 0;
    *(undefined4 *)&pTVar4[1].m_description._M_dataplus._M_p = 0;
    *(undefined1 *)((long)&pTVar4[1].m_description._M_dataplus._M_p + 4) = 1;
    *(undefined4 *)&pTVar4[1].m_description._M_string_length = 0;
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    this = (DefaultVertexAttributeTests *)local_40;
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,local_78)))
                               + 1);
    }
    puVar5 = (undefined8 *)operator_new(8);
    pTVar7 = local_48;
    *puVar5 = &PTR__FloatLoader_021280a8;
    *(undefined8 **)&pTVar4[1].m_name.field_2 = puVar5;
    tcu::TestNode::addChild(local_48,pTVar4);
    tcu::TestNode::addChild((TestNode *)this,pTVar7);
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x7c);
  return extraout_EAX;
}

Assistant:

void DefaultVertexAttributeTests::init (void)
{
	struct Target
	{
		const char*		name;
		glu::DataType	dataType;
		bool			reducedTestSets;	// !< use reduced coverage
	};

	static const Target floatTargets[] =
	{
		{ "float",	glu::TYPE_FLOAT,		false	},
		{ "vec2",	glu::TYPE_FLOAT_VEC2,	true	},
		{ "vec3",	glu::TYPE_FLOAT_VEC3,	true	},
		{ "vec4",	glu::TYPE_FLOAT_VEC4,	false	},
		{ "mat2",	glu::TYPE_FLOAT_MAT2,	true	},
		{ "mat3",	glu::TYPE_FLOAT_MAT3,	true	},
		{ "mat4",	glu::TYPE_FLOAT_MAT4,	false	},
	};

	// float targets

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(floatTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, floatTargets[targetNdx].name, (std::string("test with ") + floatTargets[targetNdx].name).c_str());
		const bool					fullSet	= !floatTargets[targetNdx].reducedTestSets;

#define ADD_CASE(X) group->addChild(AttributeCase::create<X>(m_context, floatTargets[targetNdx].dataType))
#define ADD_REDUCED_CASE(X)	if (fullSet) ADD_CASE(X)

		ADD_CASE		(LoaderVertexAttrib1f);
		ADD_REDUCED_CASE(LoaderVertexAttrib2f);
		ADD_REDUCED_CASE(LoaderVertexAttrib3f);
		ADD_CASE		(LoaderVertexAttrib4f);

		ADD_CASE		(LoaderVertexAttrib1fv);
		ADD_REDUCED_CASE(LoaderVertexAttrib2fv);
		ADD_REDUCED_CASE(LoaderVertexAttrib3fv);
		ADD_CASE		(LoaderVertexAttrib4fv);

#undef ADD_CASE
#undef ADD_REDUCED_CASE

		addChild(group);
	}
}